

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O0

TaskPool * depspawn::get_task_pool(void)

{
  TaskPool *pTVar1;
  TaskPool *in_stack_fffffffffffffff0;
  
  if (internal::TP == (TaskPool *)0x0) {
    pTVar1 = (TaskPool *)operator_new(0x230);
    internal::TaskPool::TaskPool
              (in_stack_fffffffffffffff0,(int)((ulong)pTVar1 >> 0x20),SUB81((ulong)pTVar1 >> 0x18,0)
              );
    internal::TP = pTVar1;
  }
  return internal::TP;
}

Assistant:

TaskPool& get_task_pool()
  {
#ifdef DEPSPAWN_USE_TBB
    static TaskPool Null_TP(0, 0, false);
    return Null_TP;
#else
    if(TP == nullptr) {
      TP = new TaskPool(Nthreads - 1, true);
      assert(Nthreads == (TP->nthreads() + 1));
    }
    return *TP;
#endif
  }